

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O1

size_t __thiscall
google::protobuf::internal::ExtensionSet::SpaceUsedExcludingSelfLong(ExtensionSet *this)

{
  KeyValue *pKVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  size_t total_size;
  size_t local_18;
  
  if (this->flat_capacity_ < 0x101) {
    uVar3 = (ulong)this->flat_size_;
  }
  else {
    uVar3 = (((this->map_).large)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  local_18 = uVar3 << 5;
  pKVar1 = (this->map_).flat;
  if (this->flat_capacity_ < 0x101) {
    if (this->flat_size_ != 0) {
      lVar4 = (ulong)this->flat_size_ << 5;
      do {
        sVar2 = Extension::SpaceUsedExcludingSelfLong(&pKVar1->second);
        local_18 = local_18 + sVar2;
        pKVar1 = (KeyValue *)(&pKVar1->second + 1);
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
    }
  }
  else {
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::SpaceUsedExcludingSelfLong()const::__0>
              ((_Base_ptr)(pKVar1->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar1->second,(anon_class_8_1_736c71da)&local_18);
  }
  return local_18;
}

Assistant:

bool is_large() const { return flat_capacity_ > kMaximumFlatCapacity; }